

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall RTLsTy::LoadRTLs(RTLsTy *this)

{
  value_type *pvVar1;
  list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *this_00;
  code *pcVar2;
  long lVar3;
  RTLInfoTy R;
  void *dynlib_handle;
  char *Name;
  char **__end1;
  char **__begin1;
  char *(*__range1) [4];
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  value_type *__x;
  char **local_18;
  
  TargetOffloadPolicy = __kmpc_get_target_offload();
  if (TargetOffloadPolicy != tgt_disabled) {
    for (local_18 = RTLNames; local_18 != (char **)&completed_0; local_18 = local_18 + 1) {
      pvVar1 = (value_type *)dlopen(*local_18,2);
      if (pvVar1 != (value_type *)0x0) {
        RTLInfoTy::RTLInfoTy
                  ((RTLInfoTy *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        __x = pvVar1;
        this_00 = (list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *)
                  dlsym(pvVar1,"__tgt_rtl_is_valid_binary");
        if ((((((this_00 != (list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *)0x0) &&
               (pcVar2 = (code *)dlsym(pvVar1,"__tgt_rtl_number_of_devices"), pcVar2 != (code *)0x0)
               ) && (lVar3 = dlsym(pvVar1,"__tgt_rtl_init_device"), lVar3 != 0)) &&
             ((lVar3 = dlsym(pvVar1,"__tgt_rtl_load_binary"), lVar3 != 0 &&
              (lVar3 = dlsym(pvVar1,"__tgt_rtl_data_alloc"), lVar3 != 0)))) &&
            ((lVar3 = dlsym(pvVar1,"__tgt_rtl_data_submit"), lVar3 != 0 &&
             ((lVar3 = dlsym(pvVar1,"__tgt_rtl_data_retrieve"), lVar3 != 0 &&
              (lVar3 = dlsym(pvVar1,"__tgt_rtl_data_delete"), lVar3 != 0)))))) &&
           ((lVar3 = dlsym(pvVar1,"__tgt_rtl_run_target_region"), lVar3 != 0 &&
            ((lVar3 = dlsym(pvVar1,"__tgt_rtl_run_target_team_region"), lVar3 != 0 &&
             (in_stack_ffffffffffffff44 = (*pcVar2)(), in_stack_ffffffffffffff44 != 0)))))) {
          std::__cxx11::list<RTLInfoTy,_std::allocator<RTLInfoTy>_>::push_back(this_00,__x);
        }
      }
    }
  }
  return;
}

Assistant:

void RTLsTy::LoadRTLs() {
#ifdef OMPTARGET_DEBUG
  if (char *envStr = getenv("LIBOMPTARGET_DEBUG")) {
    DebugLevel = std::stoi(envStr);
  }
#endif // OMPTARGET_DEBUG

  // Parse environment variable OMP_TARGET_OFFLOAD (if set)
  TargetOffloadPolicy = (kmp_target_offload_kind_t) __kmpc_get_target_offload();
  if (TargetOffloadPolicy == tgt_disabled) {
    return;
  }

  DP("Loading RTLs...\n");

  // Attempt to open all the plugins and, if they exist, check if the interface
  // is correct and if they are supporting any devices.
  for (auto *Name : RTLNames) {
    DP("Loading library '%s'...\n", Name);
    void *dynlib_handle = dlopen(Name, RTLD_NOW);

    if (!dynlib_handle) {
      // Library does not exist or cannot be found.
      DP("Unable to load library '%s': %s!\n", Name, dlerror());
      continue;
    }

    DP("Successfully loaded library '%s'!\n", Name);

    // Retrieve the RTL information from the runtime library.
    RTLInfoTy R;

    R.LibraryHandler = dynlib_handle;
    R.isUsed = false;

#ifdef OMPTARGET_DEBUG
    R.RTLName = Name;
#endif

    if (!(*((void**) &R.is_valid_binary) = dlsym(
              dynlib_handle, "__tgt_rtl_is_valid_binary")))
      continue;
    if (!(*((void**) &R.number_of_devices) = dlsym(
              dynlib_handle, "__tgt_rtl_number_of_devices")))
      continue;
    if (!(*((void**) &R.init_device) = dlsym(
              dynlib_handle, "__tgt_rtl_init_device")))
      continue;
    if (!(*((void**) &R.load_binary) = dlsym(
              dynlib_handle, "__tgt_rtl_load_binary")))
      continue;
    if (!(*((void**) &R.data_alloc) = dlsym(
              dynlib_handle, "__tgt_rtl_data_alloc")))
      continue;
    if (!(*((void**) &R.data_submit) = dlsym(
              dynlib_handle, "__tgt_rtl_data_submit")))
      continue;
    if (!(*((void**) &R.data_retrieve) = dlsym(
              dynlib_handle, "__tgt_rtl_data_retrieve")))
      continue;
    if (!(*((void**) &R.data_delete) = dlsym(
              dynlib_handle, "__tgt_rtl_data_delete")))
      continue;
    if (!(*((void**) &R.run_region) = dlsym(
              dynlib_handle, "__tgt_rtl_run_target_region")))
      continue;
    if (!(*((void**) &R.run_team_region) = dlsym(
              dynlib_handle, "__tgt_rtl_run_target_team_region")))
      continue;

    // No devices are supported by this RTL?
    if (!(R.NumberOfDevices = R.number_of_devices())) {
      DP("No devices supported in this RTL\n");
      continue;
    }

    DP("Registering RTL %s supporting %d devices!\n",
        R.RTLName.c_str(), R.NumberOfDevices);

    // The RTL is valid! Will save the information in the RTLs list.
    AllRTLs.push_back(R);
  }

  DP("RTLs loaded!\n");

  return;
}